

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O1

void __thiscall deqp::gles31::Functional::anon_unknown_0::VertexIDCase::deinit(VertexIDCase *this)

{
  ShaderProgram *this_00;
  GLenum GVar1;
  
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  if (this->m_elementsBuffer != 0) {
    (*this->m_gl->deleteBuffers)(1,&this->m_elementsBuffer);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"deleteBuffers(1, &m_elementsBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                    ,0x10b);
    this->m_elementsBuffer = 0;
  }
  if (this->m_coordinatesBuffer != 0) {
    (*this->m_gl->deleteBuffers)(1,&this->m_coordinatesBuffer);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"deleteBuffers(1, &m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                    ,0x111);
    this->m_coordinatesBuffer = 0;
  }
  return;
}

Assistant:

void VertexIDCase::deinit (void)
{
	delete m_program;
	m_program = DE_NULL;

	if (m_elementsBuffer)
	{
		GLU_CHECK_GLW_CALL(m_gl, deleteBuffers(1, &m_elementsBuffer));
		m_elementsBuffer = 0;
	}

	if (m_coordinatesBuffer)
	{
		GLU_CHECK_GLW_CALL(m_gl, deleteBuffers(1, &m_coordinatesBuffer));
		m_coordinatesBuffer = 0;
	}
}